

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdispnames.cpp
# Opt level: O1

int32_t uloc_getDisplayScript_63
                  (char *locale,char *displayLocale,UChar *dest,int32_t destCapacity,
                  UErrorCode *pErrorCode)

{
  int32_t iVar1;
  int32_t iVar2;
  UErrorCode err;
  UErrorCode local_2ac;
  char localeBuffer [628];
  
  err = U_ZERO_ERROR;
  if ((-1 < destCapacity) && (dest != (UChar *)0x0 || destCapacity == 0)) {
    local_2ac = U_ZERO_ERROR;
    iVar1 = uloc_getScript_63(locale,localeBuffer,0x274,&local_2ac);
    if (local_2ac < U_ILLEGAL_ARGUMENT_ERROR && local_2ac != U_STRING_NOT_TERMINATED_WARNING) {
      if (iVar1 == 0) {
        iVar1 = u_terminateUChars_63(dest,destCapacity,0,&err);
      }
      else {
        iVar1 = _getStringOrCopyKey("icudt63l-lang",displayLocale,"Scripts%stand-alone",(char *)0x0,
                                    localeBuffer,localeBuffer,dest,destCapacity,&err);
      }
      goto LAB_002882ec;
    }
  }
  err = U_ILLEGAL_ARGUMENT_ERROR;
  iVar1 = 0;
LAB_002882ec:
  if (err == U_USING_DEFAULT_WARNING) {
    iVar1 = 0;
    if ((pErrorCode != (UErrorCode *)0x0) && (iVar1 = 0, *pErrorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
      if ((-1 < destCapacity) && (dest != (UChar *)0x0 || destCapacity == 0)) {
        local_2ac = U_ZERO_ERROR;
        iVar2 = uloc_getScript_63(locale,localeBuffer,0x274,&local_2ac);
        if (local_2ac < U_ILLEGAL_ARGUMENT_ERROR && local_2ac != U_STRING_NOT_TERMINATED_WARNING) {
          if (iVar2 != 0) {
            iVar1 = _getStringOrCopyKey("icudt63l-lang",displayLocale,"Scripts",(char *)0x0,
                                        localeBuffer,localeBuffer,dest,destCapacity,pErrorCode);
            return iVar1;
          }
          iVar1 = u_terminateUChars_63(dest,destCapacity,0,pErrorCode);
          return iVar1;
        }
      }
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
  }
  else {
    *pErrorCode = err;
  }
  return iVar1;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uloc_getDisplayScript(const char* locale,
                      const char* displayLocale,
                      UChar *dest, int32_t destCapacity,
                      UErrorCode *pErrorCode)
{
	UErrorCode err = U_ZERO_ERROR;
	int32_t res = _getDisplayNameForComponent(locale, displayLocale, dest, destCapacity,
                uloc_getScript, _kScriptsStandAlone, &err);
	
	if ( err == U_USING_DEFAULT_WARNING ) {
        return _getDisplayNameForComponent(locale, displayLocale, dest, destCapacity,
                    uloc_getScript, _kScripts, pErrorCode);
	} else {
		*pErrorCode = err;
		return res;
	}
}